

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

int duckdb::History::Add(char *line,idx_t len)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  FILE *__stream;
  long lVar4;
  char *in_RDI;
  FILE *fp;
  idx_t pos;
  idx_t len_1;
  idx_t replaced_newline_count;
  char *ptr;
  char *linecopy;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  long lVar5;
  long local_38;
  long local_30;
  char *local_28;
  char *local_20;
  int local_4;
  
  if (history_max_len == 0) {
    local_4 = 0;
  }
  else {
    if (history == (undefined8 *)0x0) {
      history = (undefined8 *)malloc(history_max_len << 3);
      if (history == (undefined8 *)0x0) {
        return 0;
      }
      memset(history,0,history_max_len << 3);
    }
    if ((history_len == 0) || (iVar2 = strcmp((char *)history[history_len + -1],in_RDI), iVar2 != 0)
       ) {
      bVar1 = Utf8Proc::IsValid(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (bVar1) {
        bVar1 = Terminal::IsMultiline();
        if (bVar1) {
          local_30 = 0;
          for (local_38 = 0; in_RDI[local_38] != '\0'; local_38 = local_38 + 1) {
            if ((in_RDI[local_38] == '\r') && (in_RDI[local_38 + 1] == '\n')) {
              local_38 = local_38 + 1;
            }
            else if (in_RDI[local_38] == '\n') {
              local_30 = local_30 + 1;
            }
          }
          local_20 = (char *)malloc(local_38 + local_30 + 1);
          lVar5 = 0;
          for (local_38 = 0; in_RDI[local_38] != '\0'; local_38 = local_38 + 1) {
            if ((in_RDI[local_38] == '\r') && (in_RDI[local_38 + 1] == '\n')) {
              local_20[lVar5] = '\r';
              local_38 = local_38 + 1;
              lVar4 = lVar5 + 1;
            }
            else {
              lVar4 = lVar5;
              if (in_RDI[local_38] == '\n') {
                lVar4 = lVar5 + 1;
                local_20[lVar5] = '\r';
              }
            }
            lVar5 = lVar4 + 1;
            local_20[lVar4] = in_RDI[local_38];
          }
          local_20[lVar5] = '\0';
        }
        else {
          local_20 = strdup(in_RDI);
          local_28 = local_20;
          if (local_20 == (char *)0x0) {
            return 0;
          }
          for (; *local_28 != '\0'; local_28 = local_28 + 1) {
            if ((*local_28 == '\n') || (*local_28 == '\r')) {
              *local_28 = ' ';
            }
          }
        }
        if (history_len == history_max_len) {
          free((void *)*history);
          memmove(history,history + 1,(history_max_len + -1) * 8);
          history_len = history_len + -1;
        }
        history[history_len] = local_20;
        history_len = history_len + 1;
        if ((history_file != (char *)0x0) && (sVar3 = strlen(in_RDI), sVar3 != 0)) {
          __stream = fopen(history_file,"a");
          if (__stream == (FILE *)0x0) {
            return 1;
          }
          fprintf(__stream,"%s\n",in_RDI);
          fclose(__stream);
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int History::Add(const char *line, idx_t len) {
	char *linecopy;

	if (history_max_len == 0) {
		return 0;
	}

	/* Initialization on first call. */
	if (history == nullptr) {
		history = (char **)malloc(sizeof(char *) * history_max_len);
		if (history == nullptr) {
			return 0;
		}
		memset(history, 0, (sizeof(char *) * history_max_len));
	}

	/* Don't add duplicated lines. */
	if (history_len && !strcmp(history[history_len - 1], line)) {
		return 0;
	}

	if (!Utf8Proc::IsValid(line, len)) {
		// don't add invalid UTF8 to history
		return 0;
	}

	/* Add an heap allocated copy of the line in the history.
	 * If we reached the max length, remove the older line. */
	if (!Terminal::IsMultiline()) {
		// replace all newlines with spaces
		linecopy = strdup(line);
		if (!linecopy) {
			return 0;
		}
		for (auto ptr = linecopy; *ptr; ptr++) {
			if (*ptr == '\n' || *ptr == '\r') {
				*ptr = ' ';
			}
		}
	} else {
		// replace all '\n' with '\r\n'
		idx_t replaced_newline_count = 0;
		idx_t len;
		for (len = 0; line[len]; len++) {
			if (line[len] == '\r' && line[len + 1] == '\n') {
				// \r\n - skip past the \n
				len++;
			} else if (line[len] == '\n') {
				replaced_newline_count++;
			}
		}
		linecopy = (char *)malloc((len + replaced_newline_count + 1) * sizeof(char));
		idx_t pos = 0;
		for (len = 0; line[len]; len++) {
			if (line[len] == '\r' && line[len + 1] == '\n') {
				// \r\n - skip past the \n
				linecopy[pos++] = '\r';
				len++;
			} else if (line[len] == '\n') {
				linecopy[pos++] = '\r';
			}
			linecopy[pos++] = line[len];
		}
		linecopy[pos] = '\0';
	}
	if (history_len == history_max_len) {
		free(history[0]);
		memmove(history, history + 1, sizeof(char *) * (history_max_len - 1));
		history_len--;
	}
	history[history_len] = linecopy;
	history_len++;
	if (history_file && strlen(line) > 0) {
		// if there is a history file that we loaded from
		// append to the history
		// this way we can recover history in case of a crash
		FILE *fp;

		fp = fopen(history_file, "a");
		if (fp == nullptr) {
			return 1;
		}
		fprintf(fp, "%s\n", line);
		fclose(fp);
	}
	return 1;
}